

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O2

void __thiscall deci::array_t::Append(array_t *this,value_t *el)

{
  int iVar1;
  undefined4 extraout_var;
  value_t *local_10;
  
  iVar1 = (*el->_vptr_value_t[2])(el);
  local_10 = (value_t *)CONCAT44(extraout_var,iVar1);
  std::vector<deci::value_t*,std::allocator<deci::value_t*>>::emplace_back<deci::value_t*>
            ((vector<deci::value_t*,std::allocator<deci::value_t*>> *)&this->elements,&local_10);
  return;
}

Assistant:

void array_t::Append(const value_t& el) {
      this->elements.push_back(el.Copy());
    }